

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

void fdb_kvs_header_copy(fdb_kvs_handle *handle,filemgr *new_file,docio_handle *new_dhandle,
                        uint64_t *new_file_kv_info_offset,bool create_new)

{
  kvs_header *pkVar1;
  kvs_header *pkVar2;
  void *pvVar3;
  avl_node *paVar4;
  bool bVar5;
  uint64_t uVar6;
  avl_node *node;
  avl_node *paVar7;
  undefined7 in_register_00000081;
  kvs_header *kv_header;
  fdb_kvs_handle new_handle;
  kvs_header *local_238;
  fdb_kvs_handle local_230;
  
  if ((int)CONCAT71(in_register_00000081,create_new) != 0) {
    _fdb_kvs_header_create(&local_238);
    fdb_kvs_header_read(local_238,handle->dhandle,handle->kv_info_offset,handle->file->version,false
                       );
    local_230.log_callback.callback = (fdb_log_callback)0x0;
    local_230.log_callback.callback_ex = (fdb_log_callback_ex)0x0;
    local_230.log_callback.ctx_data = (void *)0x0;
    local_230.kv_info_offset = 0xffffffffffffffff;
    local_230.file = new_file;
    local_230.dhandle = new_dhandle;
    uVar6 = fdb_kvs_header_append(&local_230);
    if (new_file_kv_info_offset != (uint64_t *)0x0) {
      *new_file_kv_info_offset = uVar6;
    }
    bVar5 = filemgr_set_kv_header(new_file,local_238,fdb_kvs_header_free);
    if (!bVar5) {
      _fdb_kvs_header_free(local_238);
    }
    fdb_kvs_header_reset_all_stats(new_file);
  }
  pkVar1 = new_file->kv_header;
  pkVar2 = handle->file->kv_header;
  pthread_spin_lock(&pkVar2->lock);
  pthread_spin_lock(&pkVar1->lock);
  pvVar3 = pkVar2->default_kvs_cmp_param;
  pkVar1->default_kvs_cmp = pkVar2->default_kvs_cmp;
  pkVar1->default_kvs_cmp_param = pvVar3;
  pkVar1->custom_cmp_enabled = pkVar2->custom_cmp_enabled;
  node = avl_first(pkVar2->idx_id);
  while( true ) {
    if (node == (avl_node *)0x0) {
      pthread_spin_unlock(&pkVar1->lock);
      pthread_spin_unlock(&pkVar2->lock);
      return;
    }
    paVar7 = avl_search(pkVar1->idx_id,node,_kvs_cmp_id);
    if (paVar7 == (avl_node *)0x0) break;
    paVar4 = node[-6].parent;
    paVar7[-7].right = node[-7].right;
    paVar7[-6].parent = paVar4;
    paVar7[-7].parent = node[-7].parent;
    paVar7[-6].left = node[-6].left;
    paVar7[-6].right = node[-6].right;
    paVar7[-5].parent = node[-5].parent;
    paVar7[-5].left = node[-5].left;
    paVar7[-5].right = node[-5].right;
    paVar7[-4].parent = node[-4].parent;
    paVar7[-4].left = node[-4].left;
    node = avl_next(node);
  }
  __assert_fail("aa",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                ,0x2d5,
                "void fdb_kvs_header_copy(fdb_kvs_handle *, struct filemgr *, struct docio_handle *, uint64_t *, bool)"
               );
}

Assistant:

void fdb_kvs_header_copy(fdb_kvs_handle *handle,
                         struct filemgr *new_file,
                         struct docio_handle *new_dhandle,
                         uint64_t *new_file_kv_info_offset,
                         bool create_new)
{
    struct avl_node *a, *aa;
    struct kvs_node *node_old, *node_new;

    if (create_new) {
        struct kvs_header *kv_header;
        // copy KV header data in 'handle' to new file
        _fdb_kvs_header_create(&kv_header);
        // read from 'handle->dhandle', and import into 'new_file'
        fdb_kvs_header_read(kv_header, handle->dhandle,
                            handle->kv_info_offset, handle->file->version, false);

        // write KV header in 'new_file' using 'new_dhandle'
        uint64_t new_kv_info_offset;
        fdb_kvs_handle new_handle;
        new_handle.file = new_file;
        new_handle.dhandle = new_dhandle;
        new_handle.kv_info_offset = BLK_NOT_FOUND;
        new_kv_info_offset = fdb_kvs_header_append(&new_handle);
        if (new_file_kv_info_offset) {
            *new_file_kv_info_offset = new_kv_info_offset;
        }

        if (!filemgr_set_kv_header(new_file, kv_header, fdb_kvs_header_free)) {
            // LCOV_EXCL_START
            _fdb_kvs_header_free(kv_header);
        } // LCOV_EXCL_STOP
        fdb_kvs_header_reset_all_stats(new_file);
    }

    struct kvs_header* dst_h = new_file->kv_header;
    struct kvs_header* src_h = handle->file->kv_header;

    spin_lock(&src_h->lock);
    spin_lock(&dst_h->lock);
    // copy all in-memory custom cmp function pointers & seqnums
    dst_h->default_kvs_cmp = src_h->default_kvs_cmp;
    dst_h->default_kvs_cmp_param = src_h->default_kvs_cmp_param;
    dst_h->custom_cmp_enabled = src_h->custom_cmp_enabled;
    a = avl_first(src_h->idx_id);
    while (a) {
        node_old = _get_entry(a, struct kvs_node, avl_id);
        aa = avl_search(dst_h->idx_id,
                        &node_old->avl_id, _kvs_cmp_id);
        assert(aa); // MUST exist
        node_new = _get_entry(aa, struct kvs_node, avl_id);
        node_new->custom_cmp = node_old->custom_cmp;
        node_new->user_param = node_old->user_param;
        node_new->seqnum = node_old->seqnum;
        node_new->op_stat = node_old->op_stat;
        a = avl_next(a);
    }
    spin_unlock(&dst_h->lock);
    spin_unlock(&src_h->lock);
}